

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::CheckFwBusGeneration(BasePort *this,string *caller,bool doScan)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  bVar1 = true;
  if (this->FwBusGeneration != this->newFwBusGeneration) {
    poVar3 = std::operator<<(this->outStr,(string *)caller);
    poVar3 = std::operator<<(poVar3,": Firewire bus reset, old generation = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", new generation = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (doScan) {
      iVar2 = (*this->_vptr_BasePort[0x1c])(this,caller);
      return SUB41(iVar2,0);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool BasePort::CheckFwBusGeneration(const std::string &caller, bool doScan)
{
    bool ret = (FwBusGeneration == newFwBusGeneration);
    if (!ret) {
        outStr << caller << ": Firewire bus reset, old generation = " << FwBusGeneration
               << ", new generation = " << newFwBusGeneration << std::endl;
        if (doScan)
            ret = ReScanNodes(caller);
    }
    return ret;
}